

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_sei.c
# Opt level: O0

void read_sei_payload(h264_stream_t *h,bs_t *b)

{
  sei_t *psVar1;
  uint32_t uVar2;
  sei_scalability_info_t *psVar3;
  int local_24;
  int i;
  sei_t *s;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sei;
  if (psVar1->payloadType == 0x18) {
    psVar3 = (sei_scalability_info_t *)calloc(1,0x6fa0c);
    (psVar1->field_2).sei_svc = psVar3;
    read_sei_scalability_info(h,b);
  }
  else {
    psVar3 = (sei_scalability_info_t *)calloc(1,(long)psVar1->payloadSize);
    (psVar1->field_2).sei_svc = psVar3;
    for (local_24 = 0; local_24 < psVar1->payloadSize; local_24 = local_24 + 1) {
      uVar2 = bs_read_u8(b);
      *(char *)((long)((psVar1->field_2).sei_svc)->layers[0].roi + (long)local_24 + -0x4a) =
           (char)uVar2;
    }
  }
  return;
}

Assistant:

void read_sei_payload( h264_stream_t* h, bs_t* b )
{
    sei_t* s = h->sei;
    
    int i;
    switch( s->payloadType )
    {
        case SEI_TYPE_SCALABILITY_INFO:
            if( 1 )
            {
                s->sei_svc = (sei_scalability_info_t*)calloc( 1, sizeof(sei_scalability_info_t) );
            }
            read_sei_scalability_info( h, b );
            break;
        default:
            if( 1 )
            {
                s->data = (uint8_t*)calloc(1, s->payloadSize);
            }
            
            for ( i = 0; i < s->payloadSize; i++ )
                s->data[i] = bs_read_u8(b);
    }
    
    //if( 1 )
    //    read_sei_end_bits(h, b);
}